

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ValidateMessage(Parser *this,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this_00;
  int iVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *descriptor;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar3;
  int i;
  int index;
  undefined1 *puVar4;
  int col;
  int line;
  Parser *local_38;
  
  index = 0;
  local_38 = this;
  do {
    puVar4 = (undefined1 *)(proto->field_0)._impl_.options_;
    if ((MessageOptions *)puVar4 == (MessageOptions *)0x0) {
      puVar4 = _MessageOptions_default_instance_;
    }
    iVar1 = *(int *)((long)&((MessageOptions *)puVar4)->field_0 + 0x28);
    if (iVar1 <= index) goto LAB_001bc3c2;
    descriptor = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                           (&(((MessageOptions *)puVar4)->field_0)._impl_.uninterpreted_option_.
                             super_RepeatedPtrFieldBase,index);
    if (0 < *(int *)((long)&descriptor->field_0 + 0x10)) {
      this_00 = &(descriptor->field_0)._impl_.name_;
      pVVar3 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                         (&this_00->super_RepeatedPtrFieldBase,0);
      if ((pVVar3->field_0)._impl_.is_extension_ == false) {
        pVVar3 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                           (&this_00->super_RepeatedPtrFieldBase,0);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(pVVar3->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc),"map_entry");
        if (bVar2) {
          line = -1;
          col = 0;
          if (local_38->source_location_table_ != (SourceLocationTable *)0x0) {
            SourceLocationTable::Find
                      (local_38->source_location_table_,&descriptor->super_Message,OPTION_NAME,&line
                       ,&col);
          }
          RecordError(local_38,line,col,(ErrorMaker)ZEXT816(0x371fa1));
LAB_001bc3c2:
          return iVar1 <= index;
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

bool Parser::ValidateMessage(const DescriptorProto* proto) {
  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption& option =
        proto->options().uninterpreted_option(i);
    if (option.name_size() > 0 && !option.name(0).is_extension() &&
        option.name(0).name_part() == "map_entry") {
      int line = -1, col = 0;  // indicates line and column not known
      if (source_location_table_ != nullptr) {
        source_location_table_->Find(
            &option, DescriptorPool::ErrorCollector::OPTION_NAME, &line, &col);
      }
      RecordError(line, col,
                  "map_entry should not be set explicitly. "
                  "Use map<KeyType, ValueType> instead.");
      return false;
    }
  }
  return true;
}